

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O2

Var Js::RegexHelper::RegexEs6MatchImpl
              (ScriptContext *scriptContext,RecyclableObject *thisObj,JavascriptString *input,
              bool noResult,void *stackAllocationPointer)

{
  bool bVar1;
  BOOL BVar2;
  Var pvVar3;
  RecyclableObject *result;
  JavascriptString *matchStr;
  JavascriptArray *this;
  JavascriptString *input_00;
  
  bVar1 = JavascriptRegExp::GetGlobalProperty(thisObj,scriptContext);
  if (bVar1) {
    JavascriptRegExp::GetUnicodeProperty(thisObj,scriptContext);
    JavascriptRegExp::SetLastIndexProperty(thisObj,&DAT_1000000000000,scriptContext);
    this = (JavascriptArray *)0x0;
    while( true ) {
      pvVar3 = JavascriptRegExp::CallExec
                         (thisObj,input,L"RegExp.prototype[Symbol.match]",scriptContext);
      BVar2 = JavascriptOperators::IsNull(pvVar3);
      if (BVar2 != 0) break;
      result = ExecResultToRecyclableObject(pvVar3);
      matchStr = GetMatchStrFromResult(result,scriptContext);
      if (this == (JavascriptArray *)0x0) {
        this = JavascriptLibrary::CreateArray
                         ((scriptContext->super_ScriptContextBase).javascriptLibrary);
      }
      input_00 = matchStr;
      JavascriptArray::DirectAppendItem(this,matchStr);
      AdvanceLastIndex(thisObj,input_00,matchStr,false,scriptContext);
    }
    if (this == (JavascriptArray *)0x0) {
      this = (JavascriptArray *)
             (((scriptContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).nullValue.ptr;
    }
    return this;
  }
  pvVar3 = JavascriptRegExp::CallExec(thisObj,input,L"RegExp.prototype[Symbol.match]",scriptContext)
  ;
  return pvVar3;
}

Assistant:

Var RegexHelper::RegexEs6MatchImpl(ScriptContext* scriptContext, RecyclableObject *thisObj, JavascriptString *input, bool noResult, void *const stackAllocationPointer)
    {
        PCWSTR const varName = _u("RegExp.prototype[Symbol.match]");

        if (!JavascriptRegExp::GetGlobalProperty(thisObj, scriptContext))
        {
            return JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
        }
        else
        {
            bool unicode = JavascriptRegExp::GetUnicodeProperty(thisObj, scriptContext);

            JavascriptRegExp::SetLastIndexProperty(thisObj, TaggedInt::ToVarUnchecked(0), scriptContext);

            JavascriptArray* arrayResult = nullptr;

            do
            {
                Var result = JavascriptRegExp::CallExec(thisObj, input, varName, scriptContext);
                if (JavascriptOperators::IsNull(result))
                {
                    break;
                }

                RecyclableObject* resultObj = ExecResultToRecyclableObject(result);
                JavascriptString* matchStr = GetMatchStrFromResult(resultObj, scriptContext);

                if (arrayResult == nullptr)
                {
                    arrayResult = scriptContext->GetLibrary()->CreateArray();
                }

                arrayResult->DirectAppendItem(matchStr);

                AdvanceLastIndex(thisObj, input, matchStr, unicode, scriptContext);
            }
            while (true);

            return arrayResult != nullptr
                ? arrayResult
                : scriptContext->GetLibrary()->GetNull();
        }
    }